

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

IRType lj_opt_narrow_forl(jit_State *J,cTValue *tv)

{
  int iVar1;
  double dVar2;
  lua_Number sum;
  lua_Number step;
  cTValue *tv_local;
  jit_State *J_local;
  
  iVar1 = narrow_forl(J,tv);
  if (((iVar1 != 0) && (iVar1 = narrow_forl(J,tv + 1), iVar1 != 0)) &&
     (iVar1 = narrow_forl(J,tv + 2), iVar1 != 0)) {
    dVar2 = tv[1].n + tv[2].n;
    if (tv[2].n < 0.0) {
      if (-2147483648.0 <= dVar2) {
        return IRT_INT;
      }
    }
    else if (dVar2 <= 2147483647.0) {
      return IRT_INT;
    }
  }
  return IRT_NUM;
}

Assistant:

IRType lj_opt_narrow_forl(jit_State *J, cTValue *tv)
{
  lj_assertJ(tvisnumber(&tv[FORL_IDX]) &&
	     tvisnumber(&tv[FORL_STOP]) &&
	     tvisnumber(&tv[FORL_STEP]),
	     "expected number types");
  /* Narrow only if the runtime values of start/stop/step are all integers. */
  if (narrow_forl(J, &tv[FORL_IDX]) &&
      narrow_forl(J, &tv[FORL_STOP]) &&
      narrow_forl(J, &tv[FORL_STEP])) {
    /* And if the loop index can't possibly overflow. */
    lua_Number step = numberVnum(&tv[FORL_STEP]);
    lua_Number sum = numberVnum(&tv[FORL_STOP]) + step;
    if (0 <= step ? (sum <= 2147483647.0) : (sum >= -2147483648.0))
      return IRT_INT;
  }
  return IRT_NUM;
}